

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

void mbedtls_ssl_optimize_checksum
               (mbedtls_ssl_context *ssl,mbedtls_ssl_ciphersuite_t *ciphersuite_info)

{
  mbedtls_ssl_handshake_params *pmVar1;
  code *pcVar2;
  
  if (ssl->minor_ver < 3) {
    pmVar1 = ssl->handshake;
    pcVar2 = ssl_update_checksum_md5sha1;
  }
  else {
    pmVar1 = ssl->handshake;
    if (ciphersuite_info->mac == MBEDTLS_MD_SHA384) {
      pcVar2 = ssl_update_checksum_sha384;
    }
    else {
      pcVar2 = ssl_update_checksum_sha256;
    }
  }
  pmVar1->update_checksum = pcVar2;
  return;
}

Assistant:

void mbedtls_ssl_optimize_checksum( mbedtls_ssl_context *ssl,
                            const mbedtls_ssl_ciphersuite_t *ciphersuite_info )
{
    ((void) ciphersuite_info);

#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
    if( ssl->minor_ver < MBEDTLS_SSL_MINOR_VERSION_3 )
        ssl->handshake->update_checksum = ssl_update_checksum_md5sha1;
    else
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
#if defined(MBEDTLS_SHA512_C)
    if( ciphersuite_info->mac == MBEDTLS_MD_SHA384 )
        ssl->handshake->update_checksum = ssl_update_checksum_sha384;
    else
#endif
#if defined(MBEDTLS_SHA256_C)
    if( ciphersuite_info->mac != MBEDTLS_MD_SHA384 )
        ssl->handshake->update_checksum = ssl_update_checksum_sha256;
    else
#endif
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return;
    }
}